

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.cpp
# Opt level: O0

string * __thiscall BGIP_BnB_Node::SoftPrint_abi_cxx11_(BGIP_BnB_Node *this)

{
  ostream *poVar1;
  BGIP_BnB_Node *in_RSI;
  string *in_RDI;
  double dVar2;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"BGIP_BnB_Node[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,"] depth(=nr. spec. jtypes)= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI->_m_depth);
  poVar1 = std::operator<<(poVar1," F ");
  dVar2 = GetF(in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," G ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI->_m_g);
  poVar1 = std::operator<<(poVar1," H ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI->_m_h);
  std::operator<<(poVar1," nrAleft ");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BGIP_BnB_Node::SoftPrint() const 
{
    std::stringstream ss;
    ss << "BGIP_BnB_Node[" << this << "] depth(=nr. spec. jtypes)= " << _m_depth
       << " F " << GetF()
       << " G "
       << _m_g
       << " H "
       << _m_h
       << " nrAleft "
       //<< _m_nrActionsLeftToSpecify
       ;
#if INCR_EXPAND
    ss << " jaExp <";
    for(Index ja=0;ja!=_m_alreadyExpandedJA.size();++ja)
        if(_m_alreadyExpandedJA[ja])
            ss << ja << " ";
    ss << ">";
#endif
    return(ss.str());
}